

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O1

bool __thiscall ON_Interval::Union(ON_Interval *this,int count,double *t)

{
  bool bVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  if (0 < count && t != (double *)0x0) {
    do {
      if (ABS(*t) < 1.23432101234321e+308) goto LAB_0057831d;
      t = t + 1;
      bVar1 = 1 < count;
      count = count + -1;
    } while (bVar1);
    count = 0;
  }
LAB_0057831d:
  dVar6 = this->m_t[0];
  dVar5 = this->m_t[1];
  bVar1 = dVar5 == -1.23432101234321e+308 && dVar6 == -1.23432101234321e+308;
  if (t == (double *)0x0 || count < 1) {
    if (dVar5 == -1.23432101234321e+308 && dVar6 == -1.23432101234321e+308) {
      return false;
    }
    dVar7 = dVar6;
    if ((dVar5 < dVar6) && (dVar7 = dVar5, dVar6 < dVar5)) {
      dVar7 = ON_DBL_QNAN;
    }
    if (1.23432101234321e+308 <= ABS(dVar7)) {
      return false;
    }
    dVar6 = (double)(~-(ulong)(!NAN(dVar6) && !NAN(dVar5)) & (ulong)ON_DBL_QNAN |
                    (~-(ulong)(dVar5 <= dVar6) & (ulong)dVar5 |
                    -(ulong)(dVar5 <= dVar6) & (ulong)dVar6) & -(ulong)(!NAN(dVar6) && !NAN(dVar5)))
    ;
    if (dVar6 < dVar7) {
      return false;
    }
    if (1.23432101234321e+308 <= ABS(dVar6)) {
      return false;
    }
    this->m_t[0] = dVar7;
    this->m_t[1] = dVar6;
  }
  else {
    if (bVar1) {
      dVar6 = *t;
      t = t + 1;
      this->m_t[0] = dVar6;
      this->m_t[1] = dVar6;
      count = count + -1;
    }
    dVar7 = EmptyInterval.m_t[1];
    dVar6 = this->m_t[0];
    dVar5 = this->m_t[1];
    dVar4 = dVar6;
    if ((dVar5 < dVar6) && (dVar4 = dVar5, dVar6 < dVar5)) {
      dVar4 = ON_DBL_QNAN;
    }
    dVar6 = (double)(~-(ulong)(!NAN(dVar6) && !NAN(dVar5)) & (ulong)ON_DBL_QNAN |
                    (~-(ulong)(dVar5 <= dVar6) & (ulong)dVar5 |
                    -(ulong)(dVar5 <= dVar6) & (ulong)dVar6) & -(ulong)(!NAN(dVar6) && !NAN(dVar5)))
    ;
    if (0 < count) {
      iVar2 = count + 1;
      dVar5 = dVar6;
      do {
        dVar6 = *t;
        dVar3 = dVar4;
        if (((1.23432101234321e+308 <= ABS(dVar6)) || (dVar3 = dVar6, dVar6 < dVar4)) ||
           (dVar3 = dVar4, dVar6 <= dVar5)) {
          dVar6 = dVar5;
          dVar4 = dVar3;
        }
        t = t + 1;
        iVar2 = iVar2 + -1;
        dVar5 = dVar6;
      } while (1 < iVar2);
    }
    if (((dVar6 < dVar4) || (1.23432101234321e+308 <= ABS(dVar4))) ||
       (1.23432101234321e+308 <= ABS(dVar6))) {
      this->m_t[0] = EmptyInterval.m_t[0];
      this->m_t[1] = dVar7;
      return bVar1;
    }
    this->m_t[0] = dVar4;
    this->m_t[1] = dVar6;
  }
  return true;
}

Assistant:

bool ON_Interval::Union(
  int count,
  const double* t
  )
{
  bool rc = false;
  double a, mn, mx;

  if ( 0 != t )
  {
    while ( count > 0 && !ON_IsValid(*t) )
    {
      count--;
      t++;
    }
  }

  if ( count <= 0 || 0 == t )
  {
    // this may be increasing, decreasing, or empty
    if ( !IsEmptyInterval() )
    {
      mn = Min();
      mx = Max();
      if ( mn <= mx && ON_IsValid(mn) && ON_IsValid(mx) )
      {
        Set( mn, mx );
        rc = true;
      }
    }
  }
  else 
  {
    if ( IsEmptyInterval() ) 
    {
      a = *t++;
      Set( a, a );
      count--;
      rc = true;
    }
    mn = Min();
    mx = Max();
    while( count > 0 )
    {
      count--;
      a = *t++;
      if ( ON_IsValid(a) )
      {
        if ( a < mn )
          mn = a;
        else if ( a > mx )
          mx = a;
      }
    }
    if ( mn <= mx && ON_IsValid(mn) && ON_IsValid(mx) )
    {
      Set(mn,mx);
      rc = true;
    }
    else
    {
      *this = ON_Interval::EmptyInterval;
    }
  }
  return rc;
}